

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoff.cpp
# Opt level: O0

string * __thiscall
BayesianGameIdenticalPayoff::SoftPrint_abi_cxx11_(BayesianGameIdenticalPayoff *this)

{
  ostream *poVar1;
  long *in_RSI;
  string *in_RDI;
  double dVar2;
  BayesianGameBase *in_stack_00000008;
  Index jaI;
  Index jtype;
  stringstream ss;
  uint local_1cc;
  uint local_1c8;
  string local_1b8 [32];
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  BayesianGameBase::SoftPrint_abi_cxx11_(in_stack_00000008);
  std::operator<<(local_188,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  poVar1 = std::operator<<(local_188,"Utility function:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_1c8 = 0; (ulong)local_1c8 < (ulong)in_RSI[0x16]; local_1c8 = local_1c8 + 1) {
    for (local_1cc = 0; (ulong)local_1cc < (ulong)in_RSI[0x17]; local_1cc = local_1cc + 1) {
      dVar2 = (double)(**(code **)(*in_RSI + 0x80))(in_RSI,local_1c8,local_1cc);
      poVar1 = (ostream *)std::ostream::operator<<(local_188,dVar2);
      std::operator<<(poVar1," ");
    }
    std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string BayesianGameIdenticalPayoff::SoftPrint() const
{
    stringstream ss;
    ss << BayesianGameBase::SoftPrint();    
    ss << "Utility function:"<<endl;
    for(Index jtype=0; jtype < _m_nrJTypes; jtype++)
    {
        for(Index jaI=0; jaI < _m_nrJA; jaI++)
            ss << GetUtility(jtype,jaI) << " ";
        ss << endl;
    }
//    ss << _m_utilFunction->SoftPrint();
    return(ss.str());
}